

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

int __thiscall TPZFrontSym<float>::Local(TPZFrontSym<float> *this,int64_t global)

{
  int iVar1;
  ulong in_RAX;
  int iVar2;
  long lVar3;
  undefined8 uStack_28;
  
  lVar3 = (this->super_TPZFront<float>).fLocal.fStore[global];
  if (lVar3 == -1) {
    uStack_28 = in_RAX;
    if ((this->super_TPZFront<float>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
        == 0) {
      lVar3 = (this->super_TPZFront<float>).fFront;
      (this->super_TPZFront<float>).fFront = lVar3 + 1;
    }
    else {
      iVar1 = TPZStack<int,_10>::Pop(&(this->super_TPZFront<float>).fFree);
      lVar3 = (long)iVar1;
    }
    (this->super_TPZFront<float>).fLocal.fStore[global] = lVar3;
    if ((this->super_TPZFront<float>).fMaxFront <= lVar3) {
      iVar1 = (this->super_TPZFront<float>).fExpandRatio;
      iVar2 = iVar1 + (int)lVar3;
      uStack_28 = uStack_28 & 0xffffffff;
      TPZVec<float>::Resize
                (&(this->super_TPZFront<float>).fData,(long)(((iVar1 + (int)lVar3 + 1) * iVar2) / 2)
                 ,(float *)((long)&uStack_28 + 4));
      (this->super_TPZFront<float>).fMaxFront = iVar2;
    }
    if ((this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fNElements <= lVar3) {
      TPZManVector<long,_10>::Resize(&(this->super_TPZFront<float>).fGlobal,lVar3 + 1);
    }
    (this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fStore[lVar3] = global;
  }
  return (int)lVar3;
}

Assistant:

void TPZFrontSym<std::complex<long double> >::DecomposeOneEquation(int64_t ieq, TPZEqnArray<std::complex<long double> > &eqnarray)
{
	DebugStop();
}